

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rhash.c
# Opt level: O0

int rhash_file(uint hash_id,char *filepath,uchar *result)

{
  int *piVar1;
  FILE *__stream;
  rhash ctx_00;
  int res;
  rhash ctx;
  FILE *fd;
  uchar *result_local;
  char *filepath_local;
  uint hash_id_local;
  
  if ((hash_id & 0x3ff) == 0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    filepath_local._4_4_ = -1;
  }
  else {
    __stream = fopen64(filepath,"rb");
    if (__stream == (FILE *)0x0) {
      filepath_local._4_4_ = -1;
    }
    else {
      ctx_00 = rhash_init(hash_id & 0x3ff);
      if (ctx_00 == (rhash)0x0) {
        filepath_local._4_4_ = -1;
      }
      else {
        filepath_local._4_4_ = rhash_file_update(ctx_00,(FILE *)__stream);
        fclose(__stream);
        rhash_final(ctx_00,result);
        rhash_free(ctx_00);
      }
    }
  }
  return filepath_local._4_4_;
}

Assistant:

RHASH_API int rhash_file(unsigned hash_id, const char* filepath, unsigned char* result)
{
	FILE* fd;
	rhash ctx;
	int res;

	hash_id &= RHASH_ALL_HASHES;
	if (hash_id == 0) {
		errno = EINVAL;
		return -1;
	}

	if ((fd = fopen(filepath, "rb")) == NULL) return -1;

	if ((ctx = rhash_init(hash_id)) == NULL) return -1;

	res = rhash_file_update(ctx, fd); /* hash the file */
	fclose(fd);

	rhash_final(ctx, result);
	rhash_free(ctx);
	return res;
}